

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O1

bool luna::operator<(String *l,String *r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  anon_union_16_2_eed97686_for_String_2 *__s2;
  anon_union_16_2_eed97686_for_String_2 *__s1;
  
  if ((l->super_GCObject).field_0x11 == '\0') {
    __s1 = &l->field_1;
  }
  else {
    __s1 = (anon_union_16_2_eed97686_for_String_2 *)(l->field_1).str_;
  }
  if ((r->super_GCObject).field_0x11 == '\0') {
    __s2 = &r->field_1;
  }
  else {
    __s2 = (anon_union_16_2_eed97686_for_String_2 *)(r->field_1).str_;
  }
  uVar1 = r->length_;
  uVar2 = l->length_;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  iVar4 = memcmp(__s1,__s2,(ulong)uVar3);
  bVar5 = uVar2 < uVar1;
  if (iVar4 != 0) {
    bVar5 = iVar4 < 0;
  }
  return bVar5;
}

Assistant:

bool operator < (const String &l, const String &r)
        {
            auto *l_s = l.in_heap_ ? l.str_ : l.str_buffer_;
            auto *r_s = r.in_heap_ ? r.str_ : r.str_buffer_;
            auto len = std::min(l.length_, r.length_);
            auto cmp = memcmp(l_s, r_s, len);
            if (cmp == 0)
                return l.length_ < r.length_;
            else
                return cmp < 0;
        }